

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O1

void __thiscall nesvis::Gui::Gui(Gui *this,Nes *nes,PpuHelper *ppu_helper,Control *control)

{
  (this->log_widget).text_list_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->log_widget).text_list_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->log_widget).text_list_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CpuWidget::CpuWidget(&this->cpu_widget,nes,control);
  PpuWidget::PpuWidget(&this->ppu_widget,nes,ppu_helper);
  MemoryWidget::MemoryWidget(&this->memory_widget,nes);
  this->first_ = true;
  return;
}

Assistant:

Gui(n_e_s::nes::Nes *nes, PpuHelper *ppu_helper, Control *control)
            : log_widget(),
              cpu_widget(nes, control),
              ppu_widget(nes, ppu_helper),
              memory_widget(nes) {}